

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance.cpp
# Opt level: O3

void __thiscall embree::Instance::setTransform(Instance *this,AffineSpace3fa *xfm,uint timeStep)

{
  Vector *pVVar1;
  AffineSpace3ff *pAVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 *puVar10;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  if (timeStep < (this->super_Geometry).numTimeSteps) {
    uVar3 = *(undefined8 *)((long)&(xfm->l).vx.field_0 + 8);
    uVar4 = *(undefined8 *)&(xfm->l).vy.field_0;
    uVar5 = *(undefined8 *)((long)&(xfm->l).vy.field_0 + 8);
    uVar6 = *(undefined8 *)&(xfm->l).vz.field_0;
    uVar7 = *(undefined8 *)((long)&(xfm->l).vz.field_0 + 8);
    uVar8 = *(undefined8 *)&(xfm->p).field_0;
    uVar9 = *(undefined8 *)((long)&(xfm->p).field_0 + 8);
    pAVar2 = this->local2world;
    *(undefined8 *)&pAVar2[timeStep].l.vx.field_0 = *(undefined8 *)&(xfm->l).vx.field_0;
    *(undefined8 *)((long)&pAVar2[timeStep].l.vx.field_0 + 8) = uVar3;
    pVVar1 = &pAVar2[timeStep].l.vy;
    *(undefined8 *)&pVVar1->field_0 = uVar4;
    *(undefined8 *)((long)&pVVar1->field_0 + 8) = uVar5;
    pVVar1 = &pAVar2[timeStep].l.vz;
    *(undefined8 *)&pVVar1->field_0 = uVar6;
    *(undefined8 *)((long)&pVVar1->field_0 + 8) = uVar7;
    *(undefined8 *)&pAVar2[timeStep].p.field_0 = uVar8;
    *(undefined8 *)((long)&pAVar2[timeStep].p.field_0 + 8) = uVar9;
    (this->super_Geometry).field_8.field_0x1 = 0;
    Geometry::update(&this->super_Geometry);
    return;
  }
  puVar10 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"invalid timestep","");
  *puVar10 = &PTR__rtcore_error_02184a18;
  *(undefined4 *)(puVar10 + 1) = 3;
  puVar10[2] = puVar10 + 4;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar10 + 2),local_38,local_38 + local_30);
  __cxa_throw(puVar10,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

void Instance::setTransform(const AffineSpace3fa& xfm, unsigned int timeStep)
  {
    if (timeStep >= numTimeSteps)
      throw_RTCError(RTC_ERROR_INVALID_OPERATION,"invalid timestep");

    local2world[timeStep] = xfm;
    gsubtype = GTY_SUBTYPE_INSTANCE_LINEAR;
    Geometry::update();
  }